

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O3

void __thiscall
FastPForLib::SIMDFastPFor<4U>::__decodeArray
          (SIMDFastPFor<4U> *this,uint32_t *in,size_t *length,uint32_t *out,size_t nvalue)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  pointer pvVar4;
  int *piVar5;
  uint32_t uVar6;
  uint32_t *in_00;
  uint uVar7;
  uint32_t *puVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  __m128i *in_01;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  const_iterator unpackpointers [33];
  undefined8 auStack_930 [255];
  undefined8 local_138 [33];
  
  uVar10 = 1;
  lVar9 = 0x30;
  puVar8 = in + (ulong)*in + 1;
  in_00 = (uint32_t *)((long)in + ((ulong)puVar8[-1] + 3 & 0xfffffffffffffffc) + 8 + (ulong)*in * 4)
  ;
  uVar7 = in_00[-1];
  do {
    if ((uVar7 >> (uVar10 & 0x1f) & 1) != 0) {
      in_00 = SIMDFastPFor<4u>::
              unpackmesimd<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                        (in_00,(vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                *)((long)&(((this->datatobepacked).
                                            super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                          )._M_impl.super__Vector_impl_data + lVar9),uVar10 + 1);
    }
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0x318);
  auVar12 = vpbroadcastq_avx512f(ZEXT816(0x18));
  auVar13 = vpbroadcastq_avx512f(ZEXT816(8));
  *length = (long)in_00 - (long)in >> 2;
  local_138[0x18] = 0;
  local_138[0x19] = 0;
  local_138[0x1a] = 0;
  local_138[0x1b] = 0;
  local_138[0x1c] = 0;
  local_138[0x1d] = 0;
  local_138[0x1e] = 0;
  local_138[0x1f] = 0;
  local_138[0x10] = 0;
  local_138[0x11] = 0;
  local_138[0x12] = 0;
  local_138[0x13] = 0;
  local_138[0x14] = 0;
  local_138[0x15] = 0;
  local_138[0x16] = 0;
  local_138[0x17] = 0;
  local_138[8] = 0;
  local_138[9] = 0;
  local_138[10] = 0;
  local_138[0xb] = 0;
  local_138[0xc] = 0;
  local_138[0xd] = 0;
  local_138[0xe] = 0;
  local_138[0xf] = 0;
  local_138[0] = 0;
  local_138[1] = 0;
  local_138[2] = 0;
  local_138[3] = 0;
  local_138[4] = 0;
  local_138[5] = 0;
  local_138[6] = 0;
  local_138[7] = 0;
  auVar14 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
  local_138[0x20] = 0;
  pvVar4 = (this->datatobepacked).
           super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = 1;
  do {
    vpmullq_avx512dq(auVar14,auVar12);
    auVar14 = vpaddq_avx512f(auVar14,auVar13);
    auVar15 = vpgatherqq_avx512f(*(undefined8 *)
                                  ((long)&(pvVar4->
                                          super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                          )._M_impl.super__Vector_impl_data + (ulong)uVar7));
    auVar15 = vmovdqu64_avx512f(auVar15);
    *(undefined1 (*) [64])(local_138 + lVar9) = auVar15;
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x21);
  if (0x7f < nvalue) {
    in_01 = (__m128i *)(in + 1);
    uVar11 = 0;
    do {
      bVar2 = (byte)*puVar8;
      uVar10 = (uint)bVar2;
      bVar3 = *(byte *)((long)puVar8 + 1);
      uVar7 = (uint)bVar3;
      SIMD_fastunpack_32(in_01,out,uVar10);
      if (bVar3 == 0) {
        puVar8 = (uint32_t *)((long)puVar8 + 2);
      }
      else {
        pbVar1 = (byte *)((long)puVar8 + 2);
        puVar8 = (uint32_t *)((long)puVar8 + 3);
        lVar9 = (ulong)*pbVar1 - (ulong)bVar2;
        if ((int)lVar9 == 1) {
          do {
            uVar6 = *puVar8;
            puVar8 = (uint32_t *)((long)puVar8 + 1);
            out[(byte)uVar6] = out[(byte)uVar6] | 1 << (uVar10 & 0x1f);
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        else {
          piVar5 = (int *)local_138[lVar9];
          do {
            uVar6 = *puVar8;
            local_138[lVar9] = piVar5 + 1;
            puVar8 = (uint32_t *)((long)puVar8 + 1);
            out[(byte)uVar6] = out[(byte)uVar6] | *piVar5 << (uVar10 & 0x1f);
            uVar7 = uVar7 - 1;
            piVar5 = piVar5 + 1;
          } while (uVar7 != 0);
        }
      }
      uVar11 = (ulong)((int)uVar11 + 1);
      out = out + 0x80;
      in_01 = in_01 + bVar2;
    } while (uVar11 < nvalue >> 7);
  }
  return;
}

Assistant:

void __decodeArray(const uint32_t *in, size_t &length, uint32_t *out,
                     const size_t nvalue) {
    const uint32_t *const initin = in;
    const uint32_t *const headerin = in++;
    const uint32_t wheremeta = headerin[0];
    const uint32_t *inexcept = headerin + wheremeta;
    const uint32_t bytesize = *inexcept++;
    const uint8_t *bytep = reinterpret_cast<const uint8_t *>(inexcept);
    inexcept += (bytesize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    const uint32_t bitmap = *(inexcept++);
    for (uint32_t k = 2; k <= 32; ++k) {
      if ((bitmap & (1U << (k - 1))) != 0) {
        inexcept = unpackmesimd(inexcept, datatobepacked[k], k);
      }
    }
    length = inexcept - initin;
    std::vector<uint32_t, cacheallocator>::const_iterator
        unpackpointers[32 + 1];
    for (uint32_t k = 1; k <= 32; ++k) {
      unpackpointers[k] = datatobepacked[k].begin();
    }
    for (uint32_t run = 0; run < nvalue / BlockSize; ++run, out += BlockSize) {
      const uint8_t b = *bytep++;
      const uint8_t cexcept = *bytep++;
      in = unpackblocksimd(in, out, b);
      if (cexcept > 0) {
        const uint8_t maxbits = *bytep++;
        if (maxbits - b == 1) {
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= static_cast<uint32_t>(1) << b;
          }
        } else {
          std::vector<uint32_t, cacheallocator>::const_iterator &exceptionsptr =
              unpackpointers[maxbits - b];
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= (*(exceptionsptr++)) << b;
          }
        }
      }
    }
    assert(in == headerin + wheremeta);
  }